

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

string * __thiscall
t_perl_generator::perl_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_perl_generator *this,t_program *p)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  string local_a0 [32];
  long local_80;
  size_type loc;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string ns;
  t_program *p_local;
  t_perl_generator *this_local;
  string *result;
  
  ns.field_2._8_8_ = p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"perl",&local_61);
  t_program::get_namespace((string *)local_40,p,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  loc._3_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)((long)&loc + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&loc + 2));
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    while (local_80 = std::__cxx11::string::find(local_40,0x4e5538), local_80 != -1) {
      std::__cxx11::string::substr((ulong)local_a0,(ulong)local_40);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"::");
      std::__cxx11::string::substr((ulong)local_c0,(ulong)local_40);
      std::__cxx11::string::operator=((string *)local_40,local_c0);
      std::__cxx11::string::~string(local_c0);
    }
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      std::operator+(&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     "::");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
  }
  loc._3_1_ = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string perl_namespace(t_program* p) {
    std::string ns = p->get_namespace("perl");
    std::string result = "";
    std::string::size_type loc;

    if (ns.size() > 0) {
      while ((loc = ns.find(".")) != std::string::npos) {
        result += ns.substr(0, loc);
        result += "::";
        ns = ns.substr(loc + 1);
      }

      if (ns.size() > 0) {
        result += ns + "::";
      }
    }

    return result;
  }